

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86MOV(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,x86Reg src)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86Reg local_28;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  uchar *stream_local;
  
  local_28 = base;
  base_local = index;
  if (((base == rNONE) && (index != rNONE)) && (multiplier == 1)) {
    base_local = rNONE;
    local_28 = index;
  }
  iVar1 = (int)stream;
  if (size == sBYTE) {
    if (((src == rEAX) && (base_local == rNONE)) && (local_28 == rNONE)) {
      *stream = 0xa2;
      uVar2 = encodeImmDword(stream + 1,shift);
      stream_local._4_4_ = ((int)(stream + 1) + uVar2) - iVar1;
    }
    else {
      uVar2 = encodeRex(stream,4 < (int)src,src,base_local,local_28);
      puVar3 = stream + uVar2;
      *puVar3 = 0x88;
      uVar2 = encodeAddress(puVar3 + 1,base_local,multiplier,local_28,shift,(int)regCode[src]);
      stream_local._4_4_ = ((int)(puVar3 + 1) + uVar2) - iVar1;
    }
  }
  else if (size == sWORD) {
    puVar3 = stream + 1;
    *stream = 'f';
    if (((src == rEAX) && (base_local == rNONE)) && (local_28 == rNONE)) {
      *puVar3 = 0xa3;
      uVar2 = encodeImmDword(stream + 2,shift);
      stream_local._4_4_ = ((int)(stream + 2) + uVar2) - iVar1;
    }
    else {
      uVar2 = encodeRex(puVar3,false,src,base_local,local_28);
      puVar3 = puVar3 + uVar2;
      *puVar3 = 0x89;
      uVar2 = encodeAddress(puVar3 + 1,base_local,multiplier,local_28,shift,(int)regCode[src]);
      stream_local._4_4_ = ((int)(puVar3 + 1) + uVar2) - iVar1;
    }
  }
  else {
    uVar2 = encodeRex(stream,size == sQWORD,src,base_local,local_28);
    puVar3 = stream + uVar2;
    if (((src == rEAX) && (base_local == rNONE)) && (local_28 == rNONE)) {
      *puVar3 = 0xa3;
      uVar2 = encodeImmDword(puVar3 + 1,shift);
      stream_local._4_4_ = ((int)(puVar3 + 1) + uVar2) - iVar1;
    }
    else {
      *puVar3 = 0x89;
      uVar2 = encodeAddress(puVar3 + 1,base_local,multiplier,local_28,shift,(int)regCode[src]);
      stream_local._4_4_ = ((int)(puVar3 + 1) + uVar2) - iVar1;
    }
  }
  return stream_local._4_4_;
}

Assistant:

int x86MOV(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86Reg src)
{
	unsigned char *start = stream;

	if(base == rNONE && index != rNONE && multiplier == 1)	// swap so if there is only one register, it will be base
	{
		base = index;
		index = rNONE;
	}

	if(size == sBYTE)
	{
		if(src == rEAX && index == rNONE && base == rNONE)
		{
			*stream++ = 0xa2;
			stream += encodeImmDword(stream, shift);

			return int(stream - start);
		}

		// To address byte register after dl, REX prefix is required, on x86 this is not possible at all
		stream += encodeRex(stream, src > rEDX, src, index, base);
		*stream++ = 0x88;
		stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

		return int(stream - start);
	}
	else if(size == sWORD)
	{
		*stream++ = 0x66;	// switch to word

		if(src == rEAX && index == rNONE && base == rNONE)
		{
			*stream++ = 0xa3;
			stream += encodeImmDword(stream, shift);

			return int(stream - start);
		}

		stream += encodeRex(stream, false, src, index, base);
		*stream++ = 0x89;
		stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

		return int(stream - start);
	}

	stream += encodeRex(stream, size == sQWORD, src, index, base);

	if(src == rEAX && index == rNONE && base == rNONE)
	{
		*stream++ = 0xa3;
		stream += encodeImmDword(stream, shift);

		return int(stream - start);
	}

	*stream++ = 0x89;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

	return int(stream - start);
}